

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int Curl_wait_ms(int timeout_ms)

{
  int iVar1;
  int *piVar2;
  timediff_t tVar3;
  curltime older;
  curltime cVar4;
  curltime cVar5;
  curltime newer;
  
  if (timeout_ms == 0) {
    return 0;
  }
  if (timeout_ms < 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    cVar4 = Curl_now();
    iVar1 = timeout_ms;
    do {
      iVar1 = poll((pollfd *)0x0,0,iVar1);
      if (iVar1 != -1) {
LAB_0038d7ba:
        return -(uint)(iVar1 != 0);
      }
      piVar2 = __errno_location();
      if ((*piVar2 != 0) && ((*piVar2 != 4 || (Curl_ack_eintr != 0)))) goto LAB_0038d7ba;
      cVar5 = Curl_now();
      older._12_4_ = 0;
      older.tv_sec = SUB128(cVar4._0_12_,0);
      older.tv_usec = SUB124(cVar4._0_12_,8);
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar5._0_12_,0);
      newer.tv_usec = SUB124(cVar5._0_12_,8);
      tVar3 = Curl_timediff(newer,older);
      iVar1 = timeout_ms - (int)tVar3;
    } while (iVar1 != 0 && (int)tVar3 <= timeout_ms);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Curl_wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct curltime initial_tv;
  int pending_ms;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = Curl_now();
  do {
    int error;
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    pending_ms = timeout_ms - ELAPSED_MS();
    if(pending_ms <= 0) {
      r = 0;  /* Simulate a "call timed out" case */
      break;
    }
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}